

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  long lVar1;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  long lVar2;
  int i_2;
  int i;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(file + 0x88); lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(file + 0x98);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar3);
    ValidateProto3Field(this,(FieldDescriptor *)(lVar1 + lVar2),proto_00);
    lVar2 = lVar2 + 0xa8;
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(file + 0x58); lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(file + 0x60);
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar3);
    ValidateProto3Message(this,(Descriptor *)(lVar1 + lVar2),proto_01);
    lVar2 = lVar2 + 0xa8;
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(file + 0x68); lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(file + 0x70);
    proto_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar3);
    ValidateProto3Enum(this,(EnumDescriptor *)(lVar1 + lVar2),proto_02);
    lVar2 = lVar2 + 0x38;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3(
    FileDescriptor* file, const FileDescriptorProto& proto) {
  for (int i = 0; i < file->extension_count(); ++i) {
    ValidateProto3Field(file->extensions_ + i, proto.extension(i));
  }
  for (int i = 0; i < file->message_type_count(); ++i) {
    ValidateProto3Message(file->message_types_ + i, proto.message_type(i));
  }
  for (int i = 0; i < file->enum_type_count(); ++i) {
    ValidateProto3Enum(file->enum_types_ + i, proto.enum_type(i));
  }
}